

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O1

void anon_unknown.dwarf_26df18::readCopyRead(string *tempDir,char *infilename,uint correctChecksum)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  void *pvVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  ostream *poVar10;
  undefined4 *puVar11;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  char *pcVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined4 uVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  long local_188;
  ulong local_168;
  string outfilename;
  long local_120;
  long local_118;
  FrameBuffer frameBuffer;
  OutputFile file;
  Header header;
  FrameBuffer frameBuffer_1;
  
  outfilename._M_dataplus._M_p = (pointer)&outfilename.field_2;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&outfilename,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&outfilename);
  pvVar6 = operator_new__(8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   reading, ",0xc);
  std::ostream::flush();
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,infilename,iVar5);
  piVar7 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar5 = *piVar7;
  uVar15 = (piVar7[2] - iVar5) + 1;
  iVar19 = piVar7[1];
  lVar26 = (long)piVar7[3] - (long)iVar19;
  local_168 = lVar26 + 1;
  lVar17 = (long)(int)uVar15;
  pcVar8 = (char *)operator_new__(-(ulong)(local_168 * lVar17 >> 0x3d != 0) | local_168 * lVar17 * 8
                                 );
  operator_delete__(pvVar6);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            ((Rgba *)&header,(ulong)(pcVar8 + iVar19 * lVar17 * -8 + (long)iVar5 * -8),1);
  lVar9 = Imf_3_2::RgbaInputFile::dataWindow();
  iVar5 = *(int *)(lVar9 + 4);
  Imf_3_2::RgbaInputFile::dataWindow();
  Imf_3_2::RgbaInputFile::readPixels((int)&header,iVar5);
  if ((int)lVar26 < 0) {
    uVar18 = 0;
  }
  else {
    uVar21 = 0;
    uVar18 = 0;
    pcVar22 = pcVar8;
    do {
      if (0 < (int)uVar15) {
        uVar23 = 0;
        do {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(pcVar22 + uVar23 * 8);
          uVar28 = (undefined4)(*(ulong *)(pcVar22 + uVar23 * 8) >> 0x20);
          auVar29._4_4_ = uVar28;
          auVar29._0_4_ = uVar28;
          auVar29._8_4_ = uVar28;
          auVar29._12_4_ = uVar28;
          uVar18 = uVar18 ^ (ushort)(SUB162(auVar29 ^ auVar27,2) ^ SUB162(auVar29 ^ auVar27,0));
          uVar23 = uVar23 + 1;
        } while (uVar15 != uVar23);
      }
      uVar21 = uVar21 + 1;
      pcVar22 = pcVar22 + lVar17 * 8;
    } while (uVar21 != (local_168 & 0xffffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"checksum = ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ostream::flush();
  if (uVar18 != correctChecksum) {
    __assert_fail("checksum == correctChecksum",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                  ,0x40,
                  "void (anonymous namespace)::readImage(const char *, Array2D<Rgba> &, int &, int &, unsigned int)"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ok",4);
  std::ostream::flush();
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  lVar17 = lVar17 * 8;
  lVar9 = 1;
  lVar26 = 8;
  do {
    uVar21 = lVar9 * 8;
    local_120 = 8;
    local_188 = 1;
    local_118 = lVar17;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   x sampling ",0xe)
      ;
      iVar19 = (int)lVar9;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", y sampling ",0xd);
      iVar20 = (int)local_188;
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": writing image, ",0x11);
      std::ostream::flush();
      _Var4 = outfilename._M_dataplus;
      frameBuffer_1._map._M_t._M_impl._0_8_ = 0;
      Imf_3_2::Header::Header
                (&header,uVar15,(int)local_168,1.0,(Vec2 *)&frameBuffer_1,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
      puVar11 = (undefined4 *)Imf_3_2::Header::compression();
      *puVar11 = 4;
      pcVar22 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar19,iVar20,false);
      Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1bd903);
      pcVar22 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar19,iVar20,false);
      Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1bd916);
      pcVar22 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar19,iVar20,false);
      Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1bd929);
      pcVar22 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar19,iVar20,false);
      Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1c76de);
      iVar5 = Imf_3_2::globalThreadCount();
      Imf_3_2::OutputFile::OutputFile(&file,_Var4._M_p,&header,iVar5);
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,pcVar8,uVar21,0,iVar19,iVar20,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x1bd903);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,pcVar8 + 2,uVar21,0,iVar19,iVar20,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x1bd916);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,pcVar8 + 4,uVar21,0,iVar19,iVar20,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x1bd929);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,pcVar8 + 6,uVar21,0,iVar19,iVar20,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x1c76de);
      if (0 < (int)local_168) {
        local_168 = local_168 & 0xffffffff;
        pcVar22 = pcVar8;
        do {
          lVar12 = Imf_3_2::FrameBuffer::operator[]((char *)&frameBuffer);
          *(char **)(lVar12 + 8) = pcVar22;
          lVar12 = Imf_3_2::FrameBuffer::operator[]((char *)&frameBuffer);
          *(char **)(lVar12 + 8) = pcVar22 + 2;
          lVar12 = Imf_3_2::FrameBuffer::operator[]((char *)&frameBuffer);
          *(char **)(lVar12 + 8) = pcVar22 + 4;
          lVar12 = Imf_3_2::FrameBuffer::operator[]((char *)&frameBuffer);
          *(char **)(lVar12 + 8) = pcVar22 + 6;
          Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&file);
          Imf_3_2::OutputFile::writePixels((int)&file);
          pcVar22 = pcVar22 + lVar17;
          local_168 = local_168 - 1;
        } while (local_168 != 0);
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&frameBuffer);
      Imf_3_2::OutputFile::~OutputFile(&file);
      Imf_3_2::Header::~Header(&header);
      pvVar6 = operator_new__(8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading back, ",0xe)
      ;
      std::ostream::flush();
      _Var4 = outfilename._M_dataplus;
      iVar5 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&frameBuffer,_Var4._M_p,iVar5);
      Imf_3_2::InputFile::header();
      piVar7 = (int *)Imf_3_2::Header::dataWindow();
      iVar5 = *piVar7;
      iVar1 = piVar7[1];
      iVar2 = piVar7[3];
      uVar16 = piVar7[2] - iVar5;
      uVar15 = uVar16 + 1;
      uVar18 = (iVar2 - iVar1) + 1;
      local_168 = (ulong)uVar18;
      lVar12 = (long)(int)uVar15;
      uVar13 = (int)uVar18 * lVar12;
      uVar23 = uVar13 * 8;
      if (0x1fffffffffffffff < uVar13) {
        uVar23 = 0xffffffffffffffff;
      }
      pvVar14 = operator_new__(uVar23);
      operator_delete__(pvVar6);
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar22 = (char *)((long)pvVar14 + (long)(int)(uVar15 * iVar1) * -8 + (long)iVar5 * -8);
      uVar23 = (ulong)(int)(iVar20 * uVar15 * 8);
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,pcVar22,uVar21,uVar23,iVar19,iVar20,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1bd903);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,pcVar22 + 2,uVar21,uVar23,iVar19,iVar20,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1bd916);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,pcVar22 + 4,uVar21,uVar23,iVar19,iVar20,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1bd929);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,pcVar22 + 6,uVar21,uVar23,iVar19,iVar20,1.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1c76de);
      Imf_3_2::InputFile::setFrameBuffer(&frameBuffer);
      Imf_3_2::InputFile::readPixels((int)&frameBuffer,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing, ",0xb);
      std::ostream::flush();
      if (-1 < iVar2 - iVar1) {
        uVar23 = 0;
        pcVar22 = pcVar8;
        pvVar6 = pvVar14;
        do {
          if (uVar16 < 0x7fffffff) {
            lVar24 = 6;
            lVar25 = 0;
            do {
              if (*(short *)(pcVar22 + lVar24 + -6) != *(short *)((long)pvVar6 + lVar24 + -6)) {
                __assert_fail("pixels2[y][x].r.bits () == pixels[y][x].r.bits ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                              ,0x90,
                              "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                             );
              }
              if (*(short *)(pcVar22 + lVar24 + -4) != *(short *)((long)pvVar6 + lVar24 + -4)) {
                __assert_fail("pixels2[y][x].g.bits () == pixels[y][x].g.bits ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                              ,0x91,
                              "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                             );
              }
              if (*(short *)(pcVar22 + lVar24 + -2) != *(short *)((long)pvVar6 + lVar24 + -2)) {
                __assert_fail("pixels2[y][x].b.bits () == pixels[y][x].b.bits ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                              ,0x92,
                              "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                             );
              }
              if (*(short *)(pcVar22 + lVar24) != *(short *)((long)pvVar6 + lVar24)) {
                __assert_fail("pixels2[y][x].a.bits () == pixels[y][x].a.bits ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                              ,0x93,
                              "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                             );
              }
              lVar25 = lVar25 + lVar9;
              lVar24 = lVar24 + lVar26;
            } while (lVar25 < lVar12);
          }
          uVar23 = uVar23 + local_188;
          pvVar6 = (void *)((long)pvVar6 + local_120 * lVar12);
          pcVar22 = pcVar22 + local_118;
        } while (uVar23 < local_168);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&frameBuffer_1);
      Imf_3_2::InputFile::~InputFile((InputFile *)&frameBuffer);
      remove(outfilename._M_dataplus._M_p);
      operator_delete__(pvVar14);
      local_188 = local_188 + 1;
      local_120 = local_120 + 8;
      local_118 = local_118 + lVar17;
    } while (local_188 != 3);
    lVar9 = lVar9 + 1;
    lVar26 = lVar26 + 8;
    if (lVar9 == 3) {
      operator_delete__(pcVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outfilename._M_dataplus._M_p != &outfilename.field_2) {
        operator_delete(outfilename._M_dataplus._M_p,outfilename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
readCopyRead (
    const std::string& tempDir,
    const char*        infilename,
    unsigned int       correctChecksum)
{
    std::string outfilename = tempDir + "imf_test_native.exr";

    int                                  w, h;
    Array2D<OPENEXR_IMF_NAMESPACE::Rgba> pixels (1, 1);

    cout << "   reading, " << flush;
    readImage (infilename, pixels, w, h, correctChecksum);
    cout << endl;

    for (int xs = 1; xs <= 2; ++xs)
    {
        for (int ys = 1; ys <= 2; ++ys)
        {
            cout << "   x sampling " << xs << ", y sampling " << ys
                 << ": writing image, " << flush;
            writeImage (outfilename.c_str (), pixels, w, h, xs, ys);

            Array2D<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (1, 1);
            cout << "reading back, " << flush;
            readBackImage (outfilename.c_str (), pixels2, pixels, w, h, xs, ys);

            remove (outfilename.c_str ());
        }
    }
}